

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::write_open_beamlets(Plan *this)

{
  Station *this_00;
  int iVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  int iVar4;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar5;
  bool bVar6;
  long lVar7;
  _List_node_base *p_Var8;
  set<int,_std::less<int>,_std::allocator<int>_> open_beamlets;
  _List_node_base local_248;
  ofstream myfile;
  
  std::ofstream::ofstream(&myfile);
  std::ofstream::open((char *)&myfile,0x123351);
  std::operator<<((ostream *)&myfile,"Angles\t");
  plVar5 = &this->stations;
  p_Var3 = (_List_node_base *)plVar5;
  while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar5) {
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&myfile,*(int *)((long)p_Var3[1]._M_next + 8));
    std::operator<<(poVar2,"\t");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&myfile);
  iVar4 = 0;
  p_Var3 = (_List_node_base *)plVar5;
  while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar5) {
    this_00 = (Station *)p_Var3[1]._M_next;
    open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header;
    open_beamlets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         open_beamlets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    poVar2 = std::operator<<(poVar2,"Station Angle\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this_00->angle);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar7 = 0; lVar7 < this_00->max_apertures; lVar7 = lVar7 + 1) {
      poVar2 = std::operator<<((ostream *)&myfile,"Aperture\t");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar7);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&myfile,"Intensity\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this_00->intensity).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&myfile,"OpenBeamlets\t");
      Station::open_beamlets_abi_cxx11_
                ((list<int,_std::allocator<int>_> *)&local_248,this_00,(int)lVar7);
      bVar6 = true;
      p_Var8 = &local_248;
      while (p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next,
            p_Var8 != &local_248) {
        iVar1 = *(int *)&p_Var8[1]._M_next;
        if (!bVar6) {
          std::operator<<((ostream *)&myfile,"\t");
        }
        bVar6 = false;
        std::ostream::operator<<((ostream *)&myfile,iVar1 + iVar4);
      }
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                ((_List_base<int,_std::allocator<int>_> *)&local_248);
      std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    }
    iVar1 = Station::getNbBeamlets(this_00);
    iVar4 = iVar4 + iVar1;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&open_beamlets._M_t);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void Plan::write_open_beamlets(){
    ofstream myfile;
    myfile.open ("openbeamlets.txt");

    myfile << "Angles\t";
    for(auto s:stations)
      myfile << s->getAngle() << "\t";
    myfile << endl;
    int k=0;
    for(auto s:stations){
      set<int> open_beamlets;
      myfile << endl << "Station Angle\t" << s->getAngle() << endl;
      for(int i=0; i<s->getNbApertures(); i++){
        myfile << "Aperture\t" << i << endl;
        myfile << "Intensity\t" << s->intensity[i] << endl;

        myfile << "OpenBeamlets\t" ;
        bool first=true;
        for(auto beam:s->open_beamlets(i)){
          if(!first) myfile << "\t";
          first=false;
          myfile << k+beam;
        }
        myfile << endl;
      }
      k+=s->getNbBeamlets();
    }
    myfile.close();

  }